

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O0

ztast_scopearray_t * ztast_scopearray(ztast_t *ast,ztast_scopearrayinner_t *inner)

{
  ztast_scopearrayinner *in_RSI;
  long in_RDI;
  ztast_scopearray_t *scopearr;
  ztast_scopearray_t *local_8;
  
  local_8 = (ztast_scopearray_t *)(**(code **)(in_RDI + 8))(8,*(undefined8 *)(in_RDI + 0x18));
  if (local_8 == (ztast_scopearray_t *)0x0) {
    local_8 = (ztast_scopearray_t *)0x0;
  }
  else {
    local_8->inner = in_RSI;
  }
  return local_8;
}

Assistant:

ztast_scopearray_t *ztast_scopearray(ztast_t                 *ast,
                                     ztast_scopearrayinner_t *inner)
{
  ztast_scopearray_t *scopearr;

  assert(ast);
  /* inner may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scopearray\n");
#endif

  scopearr = ZTAST_MALLOC(sizeof(*scopearr));
  if (scopearr == NULL)
    return NULL;

  scopearr->inner = inner;

  return scopearr;
}